

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

wstring * __thiscall
booster::locale::impl_posix::ftime_traits<wchar_t>::ftime_abi_cxx11_
          (wstring *__return_storage_ptr__,ftime_traits<wchar_t> *this,wchar_t *format,tm *t,
          locale_t lc)

{
  ftime_traits<wchar_t> *pfVar1;
  char *pcVar2;
  ftime_traits<wchar_t> *end;
  locale_t lc_00;
  string nres;
  string nformat;
  string enc;
  string local_80;
  undefined1 local_60 [32];
  string local_40;
  
  pcVar2 = nl_langinfo_l(0xe,(__locale_t)t);
  std::__cxx11::string::string((string *)&local_40,pcVar2,(allocator *)local_60);
  end = this + -4;
  do {
    pfVar1 = end + 4;
    end = end + 4;
  } while (*(wchar_t *)pfVar1 != L'\0');
  lc_00 = (locale_t)0x0;
  conv::from_utf<wchar_t>
            ((string *)local_60,(wchar_t *)this,(wchar_t *)end,&local_40,default_method);
  ftime_traits<char>::ftime_abi_cxx11_
            (&local_80,(ftime_traits<char> *)local_60._0_8_,(char *)format,t,lc_00);
  conv::to_utf<wchar_t>
            (__return_storage_ptr__,local_80._M_dataplus._M_p,
             local_80._M_dataplus._M_p + local_80._M_string_length,&local_40,default_method);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((ftime_traits<char> *)local_60._0_8_ != (ftime_traits<char> *)(local_60 + 0x10)) {
    operator_delete((void *)local_60._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::wstring ftime(wchar_t const *format,const struct tm *t,locale_t lc)
    {
        #ifdef HAVE_WCSFTIME_L
            wchar_t buf[16];
            size_t n=wcsftime_l(buf,sizeof(buf)/sizeof(buf[0]),format,t,lc);
            if(n == 0) {
                // should be big enough
                //
                // Note standard specifies that in case of the error
                // the function returns 0, however 0 may be actually
                // valid output value of for example empty format or an
                // output of %p in some locales
                //
                // Thus we try to guess that 1024 would be enough.
                std::vector<wchar_t> v(1024);
                n = wcsftime_l(&v.front(),1024,format,t,lc);
            }
            return std::wstring(&v.front(),n);
        #else
            std::string enc = nl_langinfo_l(CODESET,lc);
            std::string nformat = conv::from_utf<wchar_t>(format,enc);
            std::string nres = ftime_traits<char>::ftime(nformat.c_str(),t,lc);
            return conv::to_utf<wchar_t>(nres,enc);
        #endif
    }